

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void FM_ADPCMAWrite(YM2610 *F2610,int r,int v)

{
  DEV_LOGGER *logger;
  byte bVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ADPCM_CH *pAVar8;
  
  F2610->adpcmreg[r] = v & 0xff;
  bVar3 = (byte)v;
  if (r == 1) {
    F2610->adpcmTL = ~bVar3 & 0x3f;
    lVar7 = 0;
    do {
      uVar2 = (uint)(&F2610->adpcm[0].IL)[lVar7] + (uint)(~bVar3 & 0x3f);
      bVar4 = (char)(uVar2 >> 3) + 1;
      bVar1 = (byte)uVar2 & 7 ^ 0xf;
      if (0x3e < uVar2) {
        bVar4 = 0;
        bVar1 = 0;
      }
      (&F2610->adpcm[0].vol_mul)[lVar7] = bVar1;
      (&F2610->adpcm[0].vol_shift)[lVar7] = bVar4;
      *(uint *)((long)&F2610->adpcm[0].adpcm_out + lVar7) =
           (int)((uint)bVar1 * *(int *)((long)&F2610->adpcm[0].adpcm_acc + lVar7)) >> (bVar4 & 0x1f)
           & 0xfffffffc;
      lVar7 = lVar7 + 0x40;
    } while (lVar7 != 0x180);
  }
  else {
    pAVar8 = F2610->adpcm;
    if (r == 0) {
      if ((char)bVar3 < '\0') {
        lVar7 = 0;
        do {
          if (((uint)v >> ((uint)lVar7 & 0x1f) & 1) != 0) {
            pAVar8->flag = '\0';
          }
          lVar7 = lVar7 + 1;
          pAVar8 = pAVar8 + 1;
        } while (lVar7 != 6);
      }
      else {
        logger = &(F2610->OPN).logger;
        lVar7 = 0;
        do {
          if (((uint)v >> ((uint)lVar7 & 0x1f) & 1) != 0) {
            uVar2 = pAVar8->start;
            pAVar8->now_addr = uVar2 * 2;
            pAVar8->now_step = 0;
            pAVar8->adpcm_acc = 0;
            pAVar8->adpcm_step = 0;
            pAVar8->adpcm_out = 0;
            pAVar8->flag = '\x01';
            if (F2610->pcmbuf == (UINT8 *)0x0) {
              emu_logf(logger,'\x02',"ADPCM-A rom not mapped\n");
            }
            else {
              uVar5 = F2610->pcm_size;
              if (uVar5 <= pAVar8->end) {
                emu_logf(logger,'\x04',"ADPCM-A end out of range: $%08x\n",(ulong)pAVar8->end);
                uVar2 = pAVar8->start;
                uVar5 = F2610->pcm_size;
              }
              if (uVar2 < uVar5) goto LAB_0012cc11;
              emu_logf(logger,'\x04',"ADPCM-A start out of range: $%08x\n");
            }
            pAVar8->flag = '\0';
          }
LAB_0012cc11:
          lVar7 = lVar7 + 1;
          pAVar8 = pAVar8 + 1;
        } while (lVar7 != 6);
      }
    }
    else {
      uVar2 = r & 7;
      if (uVar2 < 6) {
        bVar1 = (byte)r & 7;
        uVar5 = (r & 0x38U) - 8;
        uVar6 = uVar5 >> 3;
        if (uVar6 - 1 < 2) {
          F2610->adpcm[bVar1].start =
               F2610->adpcmreg[(ulong)uVar2 + 0x10] << 8 |
               F2610->adpcmreg[(ulong)uVar2 + 0x18] << 0x10;
        }
        else if (uVar6 - 3 < 2) {
          F2610->adpcm[bVar1].end =
               F2610->adpcmreg[(ulong)uVar2 + 0x20] << 8 |
               F2610->adpcmreg[(ulong)uVar2 + 0x28] << 0x10 | 0xff;
        }
        else if (uVar5 == 0) {
          F2610->adpcm[bVar1].IL = ~bVar3 & 0x1f;
          uVar2 = (uint)(~bVar3 & 0x1f) + (uint)F2610->adpcmTL;
          bVar3 = (byte)uVar2 & 7 ^ 0xf;
          bVar4 = (char)(uVar2 >> 3) + 1;
          if (0x3e < uVar2) {
            bVar3 = 0;
            bVar4 = 0;
          }
          F2610->adpcm[bVar1].vol_mul = bVar3;
          F2610->adpcm[bVar1].vol_shift = bVar4;
          F2610->adpcm[bVar1].pan =
               (INT32 *)((long)(F2610->OPN).out_adpcm + (ulong)((uint)v >> 4 & 0xc));
          F2610->adpcm[bVar1].adpcm_out =
               (int)((uint)bVar3 * F2610->adpcm[bVar1].adpcm_acc) >> (bVar4 & 0x1f) & 0xfffffffc;
        }
      }
    }
  }
  return;
}

Assistant:

static void FM_ADPCMAWrite(YM2610 *F2610,int r,int v)
{
	ADPCM_CH *adpcm = F2610->adpcm;
	UINT8 c = r&0x07;

	F2610->adpcmreg[r] = v&0xff; /* stock data */
	switch( r )
	{
	case 0x00: /* DM,--,C5,C4,C3,C2,C1,C0 */
		if( !(v&0x80) )
		{
			/* KEY ON */
			for( c = 0; c < 6; c++ )
			{
				if( (v>>c)&1 )
				{
					/**** start adpcm ****/
					// The .step variable is already set and for the YM2608 it is different on channels 4 and 5.
					//adpcm[c].step      = (UINT32)((float)(1<<ADPCM_SHIFT)*((float)F2610->OPN.ST.freqbase)/3.0);
					adpcm[c].now_addr  = adpcm[c].start<<1;
					adpcm[c].now_step  = 0;
					adpcm[c].adpcm_acc = 0;
					adpcm[c].adpcm_step= 0;
					adpcm[c].adpcm_out = 0;
					adpcm[c].flag      = 1;

					if(F2610->pcmbuf==NULL)
					{                   /* Check ROM Mapped */
						emu_logf(&F2610->OPN.logger, DEVLOG_WARN, "ADPCM-A rom not mapped\n");
						adpcm[c].flag = 0;
					}
					else
					{
						if(adpcm[c].end >= F2610->pcm_size)
						{   /* Check End in Range */
							emu_logf(&F2610->OPN.logger, DEVLOG_DEBUG, "ADPCM-A end out of range: $%08x\n",adpcm[c].end);
							/*adpcm[c].end = F2610->pcm_size-1;*/ /* JB: DO NOT uncomment this, otherwise you will break the comparison in the ADPCM_CALC_CHA() */
						}
						if(adpcm[c].start >= F2610->pcm_size)   /* Check Start in Range */
						{
							emu_logf(&F2610->OPN.logger, DEVLOG_DEBUG, "ADPCM-A start out of range: $%08x\n",adpcm[c].start);
							adpcm[c].flag = 0;
						}
					}
				}
			}
		}
		else
		{
			/* KEY OFF */
			for( c = 0; c < 6; c++ )
				if( (v>>c)&1 )
					adpcm[c].flag = 0;
		}
		break;
	case 0x01:  /* B0-5 = TL */
		F2610->adpcmTL = (v & 0x3f) ^ 0x3f;
		for( c = 0; c < 6; c++ )
		{
			int volume = F2610->adpcmTL + adpcm[c].IL;

			if ( volume >= 63 ) /* This is correct, 63 = quiet */
			{
				adpcm[c].vol_mul   = 0;
				adpcm[c].vol_shift = 0;
			}
			else
			{
				adpcm[c].vol_mul   = 15 - (volume & 7);     /* so called 0.75 dB */
				adpcm[c].vol_shift =  1 + (volume >> 3);    /* Yamaha engineers used the approximation: each -6 dB is close to divide by two (shift right) */
			}

			/* calc pcm * volume data */
			adpcm[c].adpcm_out = ((adpcm[c].adpcm_acc * adpcm[c].vol_mul) >> adpcm[c].vol_shift) & ~3;  /* multiply, shift and mask out low 2 bits */
		}
		break;
	default:
		c = r&0x07;
		if( c >= 0x06 ) return;
		switch( r&0x38 )
		{
		case 0x08:  /* B7=L,B6=R, B4-0=IL */
		{
			int volume;

			adpcm[c].IL = (v & 0x1f) ^ 0x1f;

			volume = F2610->adpcmTL + adpcm[c].IL;

			if ( volume >= 63 ) /* This is correct, 63 = quiet */
			{
				adpcm[c].vol_mul   = 0;
				adpcm[c].vol_shift = 0;
			}
			else
			{
				adpcm[c].vol_mul   = 15 - (volume & 7);     /* so called 0.75 dB */
				adpcm[c].vol_shift =  1 + (volume >> 3);    /* Yamaha engineers used the approximation: each -6 dB is close to divide by two (shift right) */
			}

			adpcm[c].pan    = &F2610->OPN.out_adpcm[(v>>6)&0x03];

			/* calc pcm * volume data */
			adpcm[c].adpcm_out = ((adpcm[c].adpcm_acc * adpcm[c].vol_mul) >> adpcm[c].vol_shift) & ~3;  /* multiply, shift and mask out low 2 bits */
		}
			break;
		case 0x10:
		case 0x18:
			adpcm[c].start  = ( (F2610->adpcmreg[0x18 + c]*0x0100 | F2610->adpcmreg[0x10 + c]) << ADPCMA_ADDRESS_SHIFT);
			break;
		case 0x20:
		case 0x28:
			adpcm[c].end    = ( (F2610->adpcmreg[0x28 + c]*0x0100 | F2610->adpcmreg[0x20 + c]) << ADPCMA_ADDRESS_SHIFT);
			adpcm[c].end   += (1<<ADPCMA_ADDRESS_SHIFT) - 1;
			break;
		}
	}
}